

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

enable_if_t<std::is_integral<unsigned_int>::value,_bool>
math::wide_integer::operator==(uintwide_t<24U,_unsigned_char,_void,_false> *u,uint *v)

{
  bool bVar1;
  uintwide_t<24U,_unsigned_char,_void,_false> local_1b;
  uint *local_18;
  uint *v_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *u_local;
  
  local_18 = v;
  v_local = (uint *)u;
  uintwide_t<24u,unsigned_char,void,false>::uintwide_t<unsigned_int>(unsigned_int,std::
  enable_if<(std::is_integral<unsigned_int>::value&&std::is_unsigned<unsigned_int>::value)&&((std::
  numeric_limits<unsigned_int>::digits>std::numeric_limits<unsigned_char>::digits)),void>::type__
            (&local_1b,*v,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  bVar1 = uintwide_t<24U,_unsigned_char,_void,_false>::operator==(u,&local_1b);
  return bVar1;
}

Assistant:

constexpr auto operator==(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const IntegralType& v) -> std::enable_if_t<std::is_integral<IntegralType>::value, bool> { return u.operator==(uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(v)); }